

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O3

BIGNUM * unmask_priv_key(EVP_PKEY *pk,uchar *buf,int len,int num_masks)

{
  int iVar1;
  EC_KEY *key;
  EC_GROUP *group;
  undefined8 uVar2;
  BIGNUM *a;
  BIGNUM *order;
  BIGNUM *b;
  BN_CTX *ctx;
  ulong uVar3;
  
  if ((pk == (EVP_PKEY *)0x0) ||
     (key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pk), key == (EC_KEY *)0x0)) {
    group = (EC_GROUP *)0x0;
  }
  else {
    group = EC_KEY_get0_group(key);
  }
  uVar2 = BN_secure_new();
  a = (BIGNUM *)BN_lebin2bn(buf,len,uVar2);
  if (a == (BIGNUM *)0x0) {
    return (BIGNUM *)0x0;
  }
  if (num_masks < 1) {
    return (BIGNUM *)a;
  }
  order = BN_new();
  if ((group == (EC_GROUP *)0x0 || order == (BIGNUM *)0x0) ||
     (iVar1 = EC_GROUP_get_order(group,order,(BN_CTX *)0x0), iVar1 < 1)) {
    BN_free(a);
    a = (BIGNUM *)0x0;
  }
  else {
    if (len == 0) goto LAB_0010ffc1;
    uVar3 = (ulong)(uint)(num_masks * len);
    do {
      uVar2 = BN_secure_new();
      b = (BIGNUM *)BN_lebin2bn(buf + uVar3,len,uVar2);
      ctx = (BN_CTX *)BN_CTX_secure_new();
      BN_mod_mul(a,a,b,order,ctx);
      BN_CTX_free(ctx);
      BN_free(b);
      uVar3 = uVar3 - (uint)len;
    } while (uVar3 != 0);
  }
  if (order == (BIGNUM *)0x0) {
    return (BIGNUM *)a;
  }
LAB_0010ffc1:
  BN_free(order);
  return (BIGNUM *)a;
}

Assistant:

static BIGNUM *unmask_priv_key(EVP_PKEY *pk,
                               const unsigned char *buf, int len, int num_masks)
{
    BIGNUM *pknum_masked = NULL, *q = NULL;
    const EC_KEY *key_ptr = (pk) ? EVP_PKEY_get0(pk) : NULL;
    const EC_GROUP *group = (key_ptr) ? EC_KEY_get0_group(key_ptr) : NULL;

    pknum_masked = BN_lebin2bn(buf, len, BN_secure_new());
    if (!pknum_masked)
        return NULL;

    if (num_masks > 0) {
        /*
         * XXX Remove sign by gost94
         */
        const unsigned char *p = buf + num_masks * len;

        q = BN_new();
        if (!q || !group || EC_GROUP_get_order(group, q, NULL) <= 0) {
            BN_free(pknum_masked);
            pknum_masked = NULL;
            goto end;
        }

        for (; p != buf; p -= len) {
            BIGNUM *mask = BN_lebin2bn(p, len, BN_secure_new());
            BN_CTX *ctx = BN_CTX_secure_new();

            BN_mod_mul(pknum_masked, pknum_masked, mask, q, ctx);

            BN_CTX_free(ctx);
            BN_free(mask);
        }
    }

 end:
    if (q)
        BN_free(q);
    return pknum_masked;
}